

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall hdc::Lex::getNextToken(Lex *this)

{
  _Map_pointer ppTVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  undefined8 uStack_18;
  
  iVar3 = this->idx;
  uVar6 = (ulong)iVar3;
  uVar5 = (this->buffer)._M_string_length;
  if (uVar6 < uVar5) {
    bVar7 = (this->buffer)._M_dataplus._M_p[uVar6];
    if (bVar7 == 10) {
      if ((this->newline == false) &&
         (ppTVar1 = (this->blockStack).c.
                    super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,
         ((long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_start._M_last -
          (long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur >> 2) +
         ((long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur -
          (long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first >> 2) +
         ((((ulong)((long)ppTVar1 -
                   (long)(this->blockStack).c.
                         super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                         super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(ppTVar1 == (_Map_pointer)0x0)) * 0x80 == 0)) {
        createToken(this,TK_NEWLINE);
      }
      advance(this);
      return;
    }
    if (bVar7 == 0x23) {
      while ((uVar5 <= (ulong)(long)iVar3 || ((this->buffer)._M_dataplus._M_p[iVar3] != '\n'))) {
        advance(this);
        uVar5 = (this->buffer)._M_string_length;
        iVar3 = this->idx;
      }
      return;
    }
    if (this->newline != false) {
LAB_0014cb58:
      getIndentation(this);
      return;
    }
    if (bVar7 == 0x27) {
      getSingleQuoteString(this);
      return;
    }
    if (bVar7 == 0x22) {
      getDoubleQuoteString(this);
      return;
    }
    if (bVar7 == 0x20) {
      skipWhitespace(this);
      return;
    }
  }
  else {
    if (this->newline != false) goto LAB_0014cb58;
    bVar7 = (this->buffer)._M_dataplus._M_p[uVar6];
  }
  if ((byte)(bVar7 - 0x30) < 10) {
    getNumber(this);
    return;
  }
  if ((char)bVar7 < 'a') {
    if (bVar7 == 0x5f || (byte)(bVar7 + 0xbf) < 0x1a) goto LAB_0014cc1e;
  }
  else if (bVar7 < 0x7b) {
LAB_0014cc1e:
    getKeywordOrIdentifier(this);
    return;
  }
  uStack_18 = in_RAX;
  bVar2 = isOperator(this);
  if (!bVar2) {
    uStack_18 = CONCAT17(bVar7,(undefined7)uStack_18);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_18 + 7),1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    return;
  }
  getOperator(this);
  return;
}

Assistant:

void Lex::getNextToken() {
    if (lookahead('\n')) {
        if (!newline && blockStack.size() == 0) {
            createToken(TK_NEWLINE);
        }

        advance();
    } else if (lookahead('#')) {
        skipComment();
    } else if (newline) {
        getIndentation();
    } else if (lookahead(' ')) {
        skipWhitespace();
    } else if (lookahead('"')) {
        getDoubleQuoteString();
    } else if (lookahead('\'')) {
        getSingleQuoteString();
    } else if (isDigit()) {
        getNumber();
    } else if (isAlpha()) {
        getKeywordOrIdentifier();
    } else if (isOperator()) {
        getOperator();
    } else {
        std::cout << buffer[idx] << "\n";
    }
}